

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

size_t __thiscall
TransitionObservationIndependentMADPDiscrete::ConstructJointObservationsRecursively
          (TransitionObservationIndependentMADPDiscrete *this,Index curAgentI,
          JointObservationDiscrete *jo,Index joI)

{
  ObservationDiscrete *a;
  pointer pvVar1;
  ObservationDiscrete *pOVar2;
  ObservationDiscrete *pOVar3;
  long lVar4;
  JointObservationDiscrete *this_00;
  JointObservationDiscrete *this_01;
  size_t sVar5;
  ostream *poVar6;
  E *pEVar7;
  long lVar8;
  Index joI_00;
  ulong uVar9;
  char *local_1d8;
  JointObservationDiscrete *p_jo;
  ostream local_1a8 [376];
  
  sVar5 = (size_t)joI;
  uVar9 = (ulong)curAgentI;
  lVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))();
  pvVar1 = (this->_m_indivObs).
           super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->_m_indivObs).
                     super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar9) {
    std::__cxx11::stringstream::stringstream((stringstream *)&p_jo);
    poVar6 = std::operator<<(local_1a8,
                             "ConstructJointObservationsRecursively - current Agent index (");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,") out of bounds! (_m_indivObs contains ");
    poVar6 = std::operator<<(poVar6,"observations for ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6," agents...)\n");
    pEVar7 = (E *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    E::E(pEVar7,local_1d8);
    __cxa_throw(pEVar7,&E::typeinfo,E::~E);
  }
  pOVar2 = pvVar1[uVar9].
           super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar3 = *(pointer *)
            ((long)&pvVar1[uVar9].
                    super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (pOVar2 == pOVar3) {
    std::__cxx11::stringstream::stringstream((stringstream *)&p_jo);
    poVar6 = std::operator<<(local_1a8," empty observation set for agent ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    pEVar7 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar7,(stringstream *)&p_jo);
    __cxa_throw(pEVar7,&E::typeinfo,E::~E);
  }
  this_00 = (JointObservationDiscrete *)operator_new(0x48);
  JointObservationDiscrete::JointObservationDiscrete(this_00,jo);
  lVar8 = 0;
  while( true ) {
    a = (ObservationDiscrete *)
        ((long)&(pOVar2->super_Observation).super_NamedDescribedEntity._vptr_NamedDescribedEntity +
        lVar8);
    joI_00 = (Index)sVar5;
    if (a == pOVar3) break;
    this_01 = jo;
    if ((lVar8 != 0) && (this_01 = this_00, a != pOVar3 + -1)) {
      this_01 = (JointObservationDiscrete *)operator_new(0x48);
      JointObservationDiscrete::JointObservationDiscrete(this_01,this_00);
    }
    p_jo = this_01;
    if (lVar4 - 1U == uVar9) {
      (this_01->super_DiscreteEntity)._m_index = joI_00;
      JointObservationDiscrete::AddIndividualObservation(this_01,a,curAgentI);
      std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::
      push_back(&this->_m_jointObs,&p_jo);
      sVar5 = (size_t)(joI_00 + 1);
    }
    else {
      JointObservationDiscrete::AddIndividualObservation(this_01,a,curAgentI);
      sVar5 = ConstructJointObservationsRecursively(this,curAgentI + 1,p_jo,joI_00);
    }
    lVar8 = lVar8 + 0x58;
  }
  return sVar5 & 0xffffffff;
}

Assistant:

size_t TransitionObservationIndependentMADPDiscrete::
ConstructJointObservationsRecursively( 
    Index curAgentI, JointObservationDiscrete& jo, Index joI)
{
    bool lastAgent=false;
    if(curAgentI == GetNrAgents()-1)
    {
        lastAgent = true;    
    }    
    if(curAgentI >= _m_indivObs.size())
    {
        stringstream ss;
        ss << "ConstructJointObservationsRecursively - current Agent index ("<<
            curAgentI<<") out of bounds! (_m_indivObs contains "<<
            "observations for "<<_m_indivObs.size() << " agents...)\n";
        throw E(ss.str().c_str());
    }
    ObservationDVec::iterator first = _m_indivObs[curAgentI].begin();
    ObservationDVec::iterator it = _m_indivObs[curAgentI].begin();
    ObservationDVec::iterator last = _m_indivObs[curAgentI].end();
    ObservationDVec::iterator beforelast = _m_indivObs[curAgentI].end();
    beforelast--;

    if(it == last)
    {
        stringstream ss;
            ss << " empty observation set for agent " << curAgentI;
        throw E(ss);
    }
    //first observation extends the received jo 
    JointObservationDiscrete* p_joReceivedArgCopy =
        new JointObservationDiscrete(jo);
    JointObservationDiscrete* p_jo;
        
    while( it != last) // other observations extend duplicates of jo
    {
        if(it == first) //
        {
            p_jo = &jo;
        }
        else if (it == beforelast)//this is the last valid it -> last observation   
        {
            p_jo = p_joReceivedArgCopy; //don't make a new copy
        }
        else //make a new copy
        {        
            p_jo = new JointObservationDiscrete(*p_joReceivedArgCopy);    
        }    
        if(lastAgent)
        {
            p_jo->SetIndex(joI);
            if(DEBUG_CJO)    
                cerr << "setting index of this observation to: "<< joI <<endl;
        }
        ObservationDiscrete* ai = /*(ObservationDiscrete*)*/ &(*it);
        if(DEBUG_CJO)    
            cerr << "Adding agent's indiv. observation to joint observation..."<<endl;
        p_jo->AddIndividualObservation(ai, curAgentI);
        
        if(lastAgent)//jointObservation is now completed:add it to the jointObservation set.
        {
            if(DEBUG_CJO)
            {cerr<<"INSERTING the joint observation:"; p_jo->Print();cerr<<endl;}
            _m_jointObs.push_back(p_jo);
            if(DEBUG_CJO){cerr << "\nINSERTED the joint observation"<<endl<< "_m_jointObservationVec now containts "<< _m_jointObs.size() << " joint actions." << endl;}
            joI++;
        }
        else
            joI = ConstructJointObservationsRecursively(curAgentI+1,*p_jo, joI);
        it++;
    }
    if(DEBUG_CJO)    cerr << ">> TransitionObservationIndependentMADPDiscrete::ConstructJointObservationsRecursively(Index "<<curAgentI<<", JointObservationDiscrete& jo, Index "<< joI<<") FINISHED"<<endl;
    return joI;
    
}